

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar_vector.hpp
# Opt level: O3

void __thiscall
cfgfile::tag_scalar_vector_t<int,_cfgfile::string_trait_t>::set_value
          (tag_scalar_vector_t<int,_cfgfile::string_trait_t> *this,int *v)

{
  constraint_t<int> *pcVar1;
  iterator __position;
  int iVar2;
  exception_t<cfgfile::string_trait_t> *this_00;
  int *value;
  undefined1 *local_190;
  long local_188;
  undefined1 local_180 [16];
  undefined1 *local_170;
  long local_168;
  undefined1 local_160 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 *local_130;
  long local_128;
  undefined1 local_120 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string_t local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar1 = this->m_constraint;
  if (pcVar1 != (constraint_t<int> *)0x0) {
    iVar2 = (*pcVar1->_vptr_constraint_t[2])(pcVar1,v);
    if ((char)iVar2 == '\0') {
      this_00 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
      local_190 = local_180;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"Invalid value: \"","");
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_f0,local_190,local_190 + local_188)
      ;
      format_t<int,cfgfile::string_trait_t>::to_string_abi_cxx11_
                (&local_d0,(format_t<int,cfgfile::string_trait_t> *)v,value);
      std::operator+(&local_b0,&local_f0,&local_d0);
      local_130 = local_120;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,"\". Value must match to the constraint in tag \"","");
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,local_130,local_130 + local_128);
      std::operator+(&local_90,&local_b0,&local_110);
      std::operator+(&local_70,&local_90,&(this->super_tag_t<cfgfile::string_trait_t>).m_name);
      local_170 = local_160;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"\".","");
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_150,local_170,local_170 + local_168);
      std::operator+(&local_50,&local_70,&local_150);
      exception_t<cfgfile::string_trait_t>::exception_t(this_00,&local_50);
      __cxa_throw(this_00,&exception_t<cfgfile::string_trait_t>::typeinfo,
                  exception_t<cfgfile::string_trait_t>::~exception_t);
    }
  }
  __position._M_current =
       (this->m_values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_values).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->m_values,__position,v);
  }
  else {
    *__position._M_current = *v;
    (this->m_values).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  (this->super_tag_t<cfgfile::string_trait_t>).m_is_defined = true;
  return;
}

Assistant:

void
	set_value( const T & v )
	{
		if( m_constraint )
		{
			if( !m_constraint->check( v ) )
				throw exception_t< Trait >(
					Trait::from_ascii( "Invalid value: \"" ) +
					typename Trait::string_t(
						format_t< T, Trait >::to_string( v ) ) +
					Trait::from_ascii( "\". Value must match to the "
						"constraint in tag \"" ) +
					this->name() + Trait::from_ascii( "\"." ) );
		}

		m_values.push_back( v );

		this->set_defined();
	}